

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void fixvisible(Fl_Type *p)

{
  bool local_19;
  Fl_Type *local_18;
  Fl_Type *t;
  Fl_Type *p_local;
  
  local_18 = p;
  do {
    if (local_18->parent == (Fl_Type *)0x0) {
      local_18->visible = '\x01';
    }
    else {
      local_19 = false;
      if (local_18->parent->visible != '\0') {
        local_19 = local_18->parent->open_ != '\0';
      }
      local_18->visible = local_19;
    }
    local_18 = local_18->next;
  } while ((local_18 != (Fl_Type *)0x0) && (p->level < local_18->level));
  return;
}

Assistant:

static void fixvisible(Fl_Type *p) {
  Fl_Type *t = p;
  for (;;) {
    if (t->parent) t->visible = t->parent->visible && t->parent->open_;
    else t->visible = 1;
    t = t->next;
    if (!t || t->level <= p->level) break;
  }
}